

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MyDB_BufferManager.cc
# Opt level: O3

MyDB_PageHandle __thiscall
MyDB_BufferManager::getPinnedPage(MyDB_BufferManager *this,MyDB_TablePtr *table,long index)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  MyDB_PageHandle MVar2;
  undefined8 local_18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  local_18 = *(undefined8 *)index;
  local_10 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(index + 8);
  if (local_10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_10->_M_use_count = local_10->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_10->_M_use_count = local_10->_M_use_count + 1;
    }
  }
  MVar2 = getPage(this,table,(long)&local_18);
  _Var1 = MVar2.super___shared_ptr<MyDB_PageHandleBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi;
  if (local_10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_10);
    _Var1._M_pi = extraout_RDX;
  }
  *(undefined1 *)(**(long **)&(this->pageMap)._M_t._M_impl + 8) = 1;
  MVar2.super___shared_ptr<MyDB_PageHandleBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  MVar2.super___shared_ptr<MyDB_PageHandleBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (MyDB_PageHandle)MVar2.super___shared_ptr<MyDB_PageHandleBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

MyDB_PageHandle MyDB_BufferManager :: getPinnedPage (MyDB_TablePtr table, long index) {
	MyDB_PageHandle phd = getPage (table, index);
	phd -> pagePtr -> isPined = true;
	return phd;
}